

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestSuiteFunc set_up_tc,TearDownTestSuiteFunc tear_down_tc,
          TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TestSuite *this_00;
  _Alloc_hider type_param;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->original_working_dir_).pathname_._M_string_length == 0) {
    FilePath::GetCurrentDir();
    std::__cxx11::string::_M_assign((string *)&this->original_working_dir_);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((this->original_working_dir_).pathname_._M_string_length == 0) {
      GTestLog::GTestLog((GTestLog *)local_50,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-internal-inl.h"
                         ,0x2b6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !original_working_dir_.IsEmpty() failed. ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to get the current working directory.",0x2c);
      GTestLog::~GTestLog((GTestLog *)local_50);
    }
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    type_param._M_p = (char *)0x0;
  }
  else {
    type_param._M_p = (pbVar1->_M_dataplus)._M_p;
  }
  this_00 = GetTestSuite(this,(test_info->test_suite_name_)._M_dataplus._M_p,type_param._M_p,
                         set_up_tc,tear_down_tc);
  TestSuite::AddTestInfo(this_00,test_info);
  return;
}

Assistant:

void AddTestInfo(internal::SetUpTestSuiteFunc set_up_tc,
                   internal::TearDownTestSuiteFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestSuite(test_info->test_suite_name(), test_info->type_param(),
                 set_up_tc, tear_down_tc)
        ->AddTestInfo(test_info);
  }